

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_drhomry(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                   Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int j_1;
  long lVar22;
  long lVar23;
  long lVar24;
  int j;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  
  pdVar7 = (datfab->super_BaseFab<double>).dptr;
  iVar1 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar23 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar9 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar16 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar22 = (long)(bx->smallend).vect[2];
  iVar6 = (bx->smallend).vect[0];
  lVar21 = (long)iVar6;
  lVar18 = (long)(bx->smallend).vect[1];
  lVar25 = ((lVar22 * 8 +
             (long)dcomp *
             (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1) * 8 +
            (long)iVar5 * -8) * lVar16 + lVar18 * 8 + (long)iVar4 * -8) * lVar9 + lVar21 * 8 +
           (long)iVar3 * -8;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar24 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar10 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
  pdVar8 = (derfab->super_BaseFab<double>).dptr;
  iVar4 = (bx->bigend).vect[0];
  lVar28 = (long)(bx->bigend).vect[1];
  lVar13 = (long)(bx->bigend).vect[2];
  lVar17 = lVar16 * lVar9 * 8;
  lVar26 = (lVar18 * 8 + (lVar22 - iVar2) * lVar23 * 8 + (long)iVar1 * -8) * lVar24 + lVar21 * 8 +
           (long)iVar3 * -8 + (long)pdVar7;
  lVar11 = (long)pdVar8 + lVar25;
  lVar16 = lVar23 * lVar24 * 8;
  for (lVar14 = lVar22; lVar27 = lVar26, lVar12 = lVar11, lVar15 = lVar18, lVar14 <= lVar13;
      lVar14 = lVar14 + 1) {
    for (; lVar15 <= lVar28; lVar15 = lVar15 + 1) {
      if (iVar6 <= iVar4) {
        lVar19 = 0;
        do {
          *(undefined8 *)(lVar12 + lVar19 * 8) = *(undefined8 *)(lVar27 + lVar19 * 8);
          lVar19 = lVar19 + 1;
        } while ((iVar4 - iVar6) + 1 != (int)lVar19);
      }
      lVar27 = lVar27 + lVar24 * 8;
      lVar12 = lVar12 + lVar9 * 8;
    }
    lVar11 = lVar11 + lVar17;
    lVar26 = lVar26 + lVar16;
  }
  lVar11 = (long)pdVar7 +
           ((lVar10 * 8 + lVar22 * 8 + (long)iVar2 * -8) * lVar23 + lVar18 * 8 + (long)iVar1 * -8) *
           lVar24 + lVar21 * 8 + (long)iVar3 * -8;
  lVar14 = 0;
  while (lVar14 != 9) {
    lVar14 = lVar14 + 1;
    lVar21 = lVar11;
    lVar27 = (long)pdVar8 + lVar25;
    for (lVar26 = lVar22; lVar12 = lVar21, lVar15 = lVar27, lVar19 = lVar18, lVar26 <= lVar13;
        lVar26 = lVar26 + 1) {
      for (; lVar19 <= lVar28; lVar19 = lVar19 + 1) {
        if (iVar6 <= iVar4) {
          lVar20 = 0;
          do {
            *(double *)(lVar15 + lVar20 * 8) =
                 *(double *)(lVar15 + lVar20 * 8) - *(double *)(lVar12 + lVar20 * 8);
            lVar20 = lVar20 + 1;
          } while ((iVar4 - iVar6) + 1 != (int)lVar20);
        }
        lVar12 = lVar12 + lVar24 * 8;
        lVar15 = lVar15 + lVar9 * 8;
      }
      lVar27 = lVar27 + lVar17;
      lVar21 = lVar21 + lVar16;
    }
    lVar11 = lVar11 + lVar23 * lVar24 * lVar10 * 8;
  }
  return;
}

Assistant:

void pelelm_drhomry (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                     const FArrayBox& datfab, const Geometry& /*geomdata*/,
                     Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == 1);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
    // we put the density in the component 0 of der array
    amrex::ParallelFor(bx,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        der(i,j,k) = in_dat(i,j,k,0);
    });
    
    // we substract to rho with every rhoY(n)
    amrex::ParallelFor(bx, NUM_SPECIES,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        der(i,j,k) -= in_dat(i,j,k,n+1);
    });
}